

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRuntimeOptions.h
# Opt level: O2

bool loadOptions(App *app,HighsLogOptions *report_log_options,HighsCommandLineOptions *c,
                HighsOptions *options)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  string *this;
  allocator local_1a1;
  HighsLogOptions *local_1a0;
  App *local_198;
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  local_1a0 = report_log_options;
  local_198 = app;
  if (c->cmd_version == true) {
    poVar4 = std::operator<<((ostream *)&std::cout,"HiGHS version ");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,1);
    poVar4 = std::operator<<(poVar4,".");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,10);
    poVar4 = std::operator<<(poVar4,".");
    std::ostream::operator<<((ostream *)poVar4,0);
    poVar4 = std::operator<<((ostream *)&std::cout," Githash ");
    poVar4 = std::operator<<(poVar4,"fd8665394");
    std::operator<<(poVar4,". ");
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)&kHighsCopyrightStatement_abi_cxx11_);
    std::endl<char,std::char_traits<char>>(poVar4);
    exit(0);
  }
  bVar1 = std::operator!=(&c->options_file,"");
  if (bVar1) {
    std::__cxx11::string::string(local_50,(string *)&c->options_file);
    iVar2 = loadOptionsFromFile(local_1a0,options,local_50);
    std::__cxx11::string::~string(local_50);
    if (iVar2 == -1) {
      return false;
    }
    if (iVar2 == 1) {
      writeOptionsToFile(_stdout,&(options->super_HighsOptionsStruct).log_options,
                         (vector *)&options->records,false,kFull);
      return false;
    }
  }
  bVar1 = std::operator!=(&c->cmd_presolve,"");
  if (bVar1) {
    std::__cxx11::string::string(local_70,(string *)&c->cmd_presolve);
    iVar2 = setLocalOptionValue(local_1a0,&kPresolveString_abi_cxx11_,
                                &(options->super_HighsOptionsStruct).log_options,&options->records,
                                local_70);
    std::__cxx11::string::~string(local_70);
    if (iVar2 != 0) {
      return false;
    }
  }
  bVar1 = std::operator!=(&c->cmd_solver,"");
  if (bVar1) {
    std::__cxx11::string::string(local_90,(string *)&c->cmd_solver);
    iVar2 = setLocalOptionValue(local_1a0,&kSolverString_abi_cxx11_,
                                &(options->super_HighsOptionsStruct).log_options,&options->records,
                                local_90);
    std::__cxx11::string::~string(local_90);
    if (iVar2 != 0) {
      return false;
    }
  }
  bVar1 = std::operator!=(&c->cmd_parallel,"");
  if (bVar1) {
    std::__cxx11::string::string(local_b0,(string *)&c->cmd_parallel);
    iVar2 = setLocalOptionValue(local_1a0,&kParallelString_abi_cxx11_,
                                &(options->super_HighsOptionsStruct).log_options,&options->records,
                                local_b0);
    std::__cxx11::string::~string(local_b0);
    if (iVar2 != 0) {
      return false;
    }
  }
  bVar1 = std::operator!=(&c->cmd_crossover,"");
  if (bVar1) {
    std::__cxx11::string::string(local_d0,(string *)&c->cmd_crossover);
    iVar2 = setLocalOptionValue(local_1a0,&kRunCrossoverString_abi_cxx11_,
                                &(options->super_HighsOptionsStruct).log_options,&options->records,
                                local_d0);
    std::__cxx11::string::~string(local_d0);
    if (iVar2 != 0) {
      return false;
    }
  }
  std::operator+(&local_f0,"--",&kTimeLimitString_abi_cxx11_);
  sVar3 = CLI::App::count(local_198,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  if ((sVar3 != 0) &&
     (iVar2 = setLocalOptionValue(local_1a0,(string *)&kTimeLimitString_abi_cxx11_,
                                  (vector *)&options->records,c->cmd_time_limit), iVar2 != 0)) {
    return false;
  }
  bVar1 = std::operator!=(&c->cmd_solution_file,"");
  if (bVar1) {
    std::__cxx11::string::string(local_150,(string *)&c->cmd_solution_file);
    iVar2 = setLocalOptionValue(local_1a0,&kSolutionFileString_abi_cxx11_,
                                &(options->super_HighsOptionsStruct).log_options,&options->records,
                                local_150);
    if (iVar2 == 0) {
      std::__cxx11::string::string(local_190,"write_solution_to_file",&local_1a1);
      iVar2 = setLocalOptionValue(local_1a0,local_190,(vector *)&options->records,true);
      std::__cxx11::string::~string(local_190);
      std::__cxx11::string::~string(local_150);
      if (iVar2 != 0) {
        return false;
      }
      goto LAB_0010d7bd;
    }
    this = local_150;
LAB_0010d81c:
    std::__cxx11::string::~string(this);
  }
  else {
LAB_0010d7bd:
    bVar1 = std::operator!=(&c->cmd_write_model_file,"");
    if (bVar1) {
      std::__cxx11::string::string(local_170,(string *)&c->cmd_write_model_file);
      iVar2 = setLocalOptionValue(local_1a0,&kWriteModelFileString_abi_cxx11_,
                                  &(options->super_HighsOptionsStruct).log_options,&options->records
                                  ,local_170);
      if (iVar2 != 0) {
        this = local_170;
        goto LAB_0010d81c;
      }
      std::__cxx11::string::string(local_190,"write_model_to_file",&local_1a1);
      iVar2 = setLocalOptionValue(local_1a0,local_190,(vector *)&options->records,true);
      std::__cxx11::string::~string(local_190);
      std::__cxx11::string::~string(local_170);
      if (iVar2 != 0) {
        return false;
      }
    }
    std::operator+(&local_110,"--",&kRandomSeedString_abi_cxx11_);
    sVar3 = CLI::App::count(local_198,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    if ((sVar3 == 0) ||
       (iVar2 = setLocalOptionValue(local_1a0,(string *)&kRandomSeedString_abi_cxx11_,
                                    (vector *)&options->records,c->cmd_random_seed), iVar2 == 0)) {
      bVar1 = std::operator!=(&c->cmd_ranging,"");
      if (bVar1) {
        std::__cxx11::string::string(local_130,(string *)&c->cmd_ranging);
        iVar2 = setLocalOptionValue(local_1a0,&kRangingString_abi_cxx11_,
                                    &(options->super_HighsOptionsStruct).log_options,
                                    &options->records,local_130);
        std::__cxx11::string::~string(local_130);
        if (iVar2 != 0) {
          return false;
        }
      }
      if ((c->model_file)._M_string_length != 0) {
        return true;
      }
      std::operator<<((ostream *)&std::cout,"Please specify filename in .mps|.lp|.ems format.\n");
    }
  }
  return false;
}

Assistant:

bool loadOptions(const CLI::App& app, const HighsLogOptions& report_log_options,
                 const HighsCommandLineOptions& c, HighsOptions& options) {
  if (c.cmd_version) {
    std::cout << "HiGHS version " << HIGHS_VERSION_MAJOR << "."
              << HIGHS_VERSION_MINOR << "." << HIGHS_VERSION_PATCH;
    std::cout << " Githash " << HIGHS_GITHASH << ". ";
    std::cout << kHighsCopyrightStatement << std::endl;
    exit(0);
  }

  // Options file.
  if (c.options_file != "") {
    switch (loadOptionsFromFile(report_log_options, options, c.options_file)) {
      case HighsLoadOptionsStatus::kError:
        return false;
      case HighsLoadOptionsStatus::kEmpty:
        writeOptionsToFile(stdout, options.log_options, options.records);
        return false;
      default:
        break;
    }
  }
  // Handle command line option specifications.
  // Presolve option.
  if (c.cmd_presolve != "") {
    if (setLocalOptionValue(report_log_options, kPresolveString,
                            options.log_options, options.records,
                            c.cmd_presolve) != OptionStatus::kOk)
      return false;
  }

  // Solver option.
  if (c.cmd_solver != "") {
    if (setLocalOptionValue(report_log_options, kSolverString,
                            options.log_options, options.records,
                            c.cmd_solver) != OptionStatus::kOk)
      return false;
  }

  // Parallel option.
  if (c.cmd_parallel != "") {
    if (setLocalOptionValue(report_log_options, kParallelString,
                            options.log_options, options.records,
                            c.cmd_parallel) != OptionStatus::kOk)
      return false;
  }

  // Run crossover option.
  if (c.cmd_crossover != "") {
    if (setLocalOptionValue(report_log_options, kRunCrossoverString,
                            options.log_options, options.records,
                            c.cmd_crossover) != OptionStatus::kOk)
      return false;
  }

  // Time limit option.
  if (app.count("--" + kTimeLimitString) > 0) {
    if (setLocalOptionValue(report_log_options, kTimeLimitString,
                            options.records,
                            c.cmd_time_limit) != OptionStatus::kOk)
      return false;
  }

  // Solution file option.
  if (c.cmd_solution_file != "") {
    if (setLocalOptionValue(report_log_options, kSolutionFileString,
                            options.log_options, options.records,
                            c.cmd_solution_file) != OptionStatus::kOk ||
        setLocalOptionValue(report_log_options, "write_solution_to_file",
                            options.records, true) != OptionStatus::kOk)
      return false;
  }

  // Write model file option.
  if (c.cmd_write_model_file != "") {
    // std::cout << "Multiple write model files not implemented.\n";
    if (setLocalOptionValue(report_log_options, kWriteModelFileString,
                            options.log_options, options.records,
                            c.cmd_write_model_file) != OptionStatus::kOk ||
        setLocalOptionValue(report_log_options, "write_model_to_file",
                            options.records, true) != OptionStatus::kOk)
      return false;
  }

  // Random seed option.
  if (app.count("--" + kRandomSeedString) > 0) {
    HighsInt value = c.cmd_random_seed;
    if (setLocalOptionValue(report_log_options, kRandomSeedString,
                            options.records, value) != OptionStatus::kOk)
      return false;
  }

  // Ranging option.
  if (c.cmd_ranging != "") {
    if (setLocalOptionValue(report_log_options, kRangingString,
                            options.log_options, options.records,
                            c.cmd_ranging) != OptionStatus::kOk)
      return false;
  }

  // If this horrible hack is still needed, please add it to RunHighs.
  // model_file is now const in this method.

  // const bool horrible_hack_for_windows_visual_studio = false;
  // if (horrible_hack_for_windows_visual_studio) {
  //   // Until I know how to debug an executable using command line
  //   // arguments in Visual Studio on Windows, this is necessary!
  //   HighsInt random_seed = -3;
  //   if (random_seed >= 0) {
  //     if (setLocalOptionValue(report_log_options, kRandomSeedString,
  //                             options.records,
  //                             random_seed) != OptionStatus::kOk)
  //       return false;
  //   }
  //   model_file = "ml.mps";
  // }

  if (c.model_file.size() == 0) {
    std::cout << "Please specify filename in .mps|.lp|.ems format.\n";
    return false;
  }

  return true;
}